

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddCompileDefinition(cmMakefile *this,string *option)

{
  char *value;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *option_local;
  cmMakefile *this_local;
  
  local_18 = option;
  option_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"COMPILE_DEFINITIONS",&local_39);
  value = (char *)std::__cxx11::string::c_str();
  AppendProperty(this,&local_38,value,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmMakefile::AddCompileDefinition(std::string const& option)
{
  this->AppendProperty("COMPILE_DEFINITIONS", option.c_str());
}